

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  char *pcVar6;
  void *in_RCX;
  void *in_RDX;
  float in_ESI;
  char *in_RDI;
  void *in_R8;
  long in_R9;
  float _x;
  float fVar7;
  uint in_stack_00000008;
  ImGuiTextFlags in_stack_00000024;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *label_end;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_frame_padding;
  float button_size;
  bool value_changed;
  char buf [64];
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  void *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  ImGuiDataType in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  ImGuiInputTextCallback in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImGuiInputTextFlags flags_00;
  size_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  bool local_99;
  ImGuiButtonFlags in_stack_ffffffffffffff8c;
  ImVec2 *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  bool local_1;
  
  flags_00 = (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  pIVar5 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    if (in_R9 == 0) {
      DataTypeGetInfo((ImGuiDataType)in_ESI);
    }
    DataTypeFormatString
              (in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff04,
               (ImGuiDataType)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(char *)0x186c19);
    local_99 = false;
    if (in_RCX == (void *)0x0) {
      bVar3 = InputText((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,flags_00,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (bVar3) {
        local_99 = DataTypeApplyFromText
                             (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                              in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
    }
    else {
      _x = GetFrameHeight();
      BeginGroup();
      PushID(in_stack_ffffffffffffff10);
      fVar7 = CalcItemWidth();
      fVar4 = -(_x + (pIVar2->Style).ItemInnerSpacing.x);
      fVar4 = ImMax<float>(1.0,fVar4 + fVar4 + fVar7);
      SetNextItemWidth(fVar4);
      bVar3 = InputText((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,flags_00,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (bVar3) {
        local_99 = DataTypeApplyFromText
                             (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                              in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
      IVar1 = (pIVar2->Style).FramePadding;
      (pIVar2->Style).FramePadding.x = (pIVar2->Style).FramePadding.y;
      if ((in_stack_00000008 & 0x4000) != 0) {
        BeginDisabled(SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0));
      }
      SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff4c,_x,_x);
      bVar3 = ButtonEx(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
      if (bVar3) {
        DataTypeApplyOp((ImGuiDataType)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                        (int)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        (void *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffef8);
        local_99 = true;
      }
      SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,_x,_x);
      bVar3 = ButtonEx(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
      if (bVar3) {
        if ((((pIVar2->IO).KeyCtrl & 1U) != 0) && (in_R8 != (void *)0x0)) {
          in_RCX = in_R8;
        }
        DataTypeApplyOp((ImGuiDataType)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RDX,
                        (void *)CONCAT44(in_ESI,in_stack_ffffffffffffff00),in_RCX);
        local_99 = true;
        in_stack_ffffffffffffff04 = in_ESI;
      }
      if ((in_stack_00000008 & 0x4000) != 0) {
        EndDisabled();
      }
      pcVar6 = FindRenderedTextEnd(in_RDI,(char *)0x0);
      if (in_RDI != pcVar6) {
        SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        TextEx(in_stack_00000030,in_stack_00000028,in_stack_00000024);
      }
      (pIVar2->Style).FramePadding = IVar1;
      PopID();
      EndGroup();
    }
    if (local_99 != false) {
      MarkItemEdited((pIVar2->LastItemData).ID);
    }
    local_1 = local_99;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;
    flags |= ImGuiInputTextFlags_NoMarkEdited;  // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}